

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O2

HelicsTranslator
helicsFederateRegisterGlobalTranslator
          (HelicsFederate fed,HelicsTranslatorTypes type,char *name,HelicsError *err)

{
  size_t sVar1;
  Filter *pFVar2;
  HelicsTranslator pvVar3;
  _Alloc_hider _Var4;
  string_view translatorName;
  __single_object trans;
  shared_ptr<helics::Federate> fedObj;
  _Head_base<0UL,_helics::TranslatorObject_*,_false> local_58;
  __uniq_ptr_impl<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> local_50
  ;
  __shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  getFedSharedPtr(&local_48,(HelicsError *)fed);
  if (local_48._M_ptr == (Federate *)0x0) {
    pvVar3 = (HelicsTranslator)0x0;
  }
  else {
    std::make_unique<helics::TranslatorObject>();
    sVar1 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (name != (char *)0x0) {
      sVar1 = strlen(name);
      _Var4._M_p = name;
    }
    local_38 = 0;
    uStack_30 = 0;
    translatorName._M_str = _Var4._M_p;
    translatorName._M_len = sVar1;
    pFVar2 = helics::Federate::registerGlobalTranslator
                       (local_48._M_ptr,type,translatorName,(string_view)ZEXT816(0),
                        (string_view)ZEXT816(0));
    (local_58._M_head_impl)->transPtr = (Translator *)pFVar2;
    std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_58._M_head_impl)->fedptr).
                super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    (local_58._M_head_impl)->custom = type == HELICS_TRANSLATOR_TYPE_CUSTOM;
    local_50._M_t.
    super__Tuple_impl<0UL,_helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>
    .super__Head_base<0UL,_helics::TranslatorObject_*,_false>._M_head_impl =
         (tuple<helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>)
         (tuple<helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>)
         local_58._M_head_impl;
    local_58._M_head_impl = (TranslatorObject *)0x0;
    pvVar3 = federateAddTranslator
                       (fed,(unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                             *)&local_50);
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    ~unique_ptr((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                 *)&local_50);
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    ~unique_ptr((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                 *)&local_58);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return pvVar3;
}

Assistant:

HelicsTranslator helicsFederateRegisterGlobalTranslator(HelicsFederate fed, HelicsTranslatorTypes type, const char* name, HelicsError* err)
{
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto trans = std::make_unique<helics::TranslatorObject>();
        trans->transPtr = &fedObj->registerGlobalTranslator(type, AS_STRING_VIEW(name));
        trans->fedptr = std::move(fedObj);
        trans->custom = (type == HELICS_TRANSLATOR_TYPE_CUSTOM);
        return federateAddTranslator(fed, std::move(trans));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}